

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

Vector<float,_3,_true> __thiscall
Nova::Image<float>::Byte_Color_To_Scalar_Color<3>
          (Image<float> *this,Vector<unsigned_char,_3,_true> *color_in)

{
  Vector<float,_3,_true> *data_copy_1;
  undefined8 extraout_XMM0_Qa;
  Vector<float,_3,_true> VVar2;
  Vector<float,_3,_true> data_copy;
  float local_5c;
  Vector<float,_3,_true> local_58;
  Vector<float,_3,_true> local_4c;
  Nova local_40 [12];
  Vector<float,_3,_true> local_34;
  float fVar1;
  
  Vector<float,_3,_true>::Vector<unsigned_char>(&local_34,color_in);
  local_5c = 0.5;
  Vector<float,_3,_true>::Vector(&local_4c,1.0);
  VVar2 = operator*(local_40,&local_5c,&local_4c);
  fVar1 = VVar2._data._M_elems[2];
  local_58._data._M_elems[2] = local_34._data._M_elems[2];
  local_58._data._M_elems[0] = local_34._data._M_elems[0];
  local_58._data._M_elems[1] = local_34._data._M_elems[1];
  Vector<float,_3,_true>::operator+=(&local_58,(Vector<float,_3,_true> *)local_40);
  *(undefined8 *)this = local_58._data._M_elems._0_8_;
  *(float *)(this + 8) = local_58._data._M_elems[2];
  Vector<float,_3,_true>::operator/=((Vector<float,_3,_true> *)this,256.0);
  VVar2._data._M_elems[2] = fVar1;
  VVar2._data._M_elems[0] = (float)(int)extraout_XMM0_Qa;
  VVar2._data._M_elems[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector<float,_3,_true>)VVar2._data._M_elems;
}

Assistant:

static Vector<T,d> Byte_Color_To_Scalar_Color(const Vector<unsigned char,d>& color_in)
    {return (Vector<T,d>(color_in)+(T).5*Vector<T,d>(1))/(T)256;}